

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# junit_log_formatter.hpp
# Opt level: O0

junit_log_helper * __thiscall
boost::unit_test::output::junit_log_formatter::get_current_log_entry(junit_log_formatter *this)

{
  bool bVar1;
  pointer ppVar2;
  long in_RDI;
  iterator it;
  map<unsigned_long,_boost::unit_test::output::junit_impl::junit_log_helper,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_boost::unit_test::output::junit_impl::junit_log_helper>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_20;
  _Self local_18 [2];
  junit_log_helper *local_8;
  
  bVar1 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0xb0));
  if (bVar1) {
    local_8 = (junit_log_helper *)(in_RDI + 0x40);
  }
  else {
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::back
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x10));
    local_18[0]._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_boost::unit_test::output::junit_impl::junit_log_helper,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_boost::unit_test::output::junit_impl::junit_log_helper>_>_>
         ::find(in_stack_ffffffffffffffc8,(key_type *)0x2373f2);
    local_20._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_boost::unit_test::output::junit_impl::junit_log_helper,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_boost::unit_test::output::junit_impl::junit_log_helper>_>_>
         ::end(in_stack_ffffffffffffffc8);
    bVar1 = std::operator==(local_18,&local_20);
    if (bVar1) {
      local_8 = (junit_log_helper *)(in_RDI + 0x40);
    }
    else {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_boost::unit_test::output::junit_impl::junit_log_helper>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_boost::unit_test::output::junit_impl::junit_log_helper>_>
                             *)0x237438);
      local_8 = &ppVar2->second;
    }
  }
  return local_8;
}

Assistant:

junit_impl::junit_log_helper& get_current_log_entry() {
        if(list_path_to_root.empty())
            return runner_log_entry;
        map_trace_t::iterator it = map_tests.find(list_path_to_root.back());
        return (it == map_tests.end() ? runner_log_entry : it->second);
    }